

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

double Catch::Benchmark::Detail::weighted_average_quantile(int k,int q,iterator first,iterator last)

{
  long lVar1;
  double dVar2;
  double *pdVar3;
  ulong uVar4;
  double *pdVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  uVar4 = (long)last._M_current - (long)first._M_current >> 3;
  dVar8 = (double)(long)((long)k * (uVar4 - 1)) / (double)q;
  dVar9 = dVar8 - (double)(int)dVar8;
  pdVar6 = first._M_current + (int)dVar8;
  if ((last._M_current != first._M_current) && (pdVar6 != last._M_current)) {
    lVar1 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introselect<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (first._M_current,pdVar6,last._M_current,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
  }
  dVar8 = *pdVar6;
  if ((dVar9 != 0.0) || (NAN(dVar9))) {
    pdVar5 = pdVar6 + 1;
    pdVar6 = pdVar6 + 2;
    if (pdVar6 != last._M_current && pdVar5 != last._M_current) {
      dVar7 = *pdVar5;
      do {
        dVar2 = *pdVar6;
        pdVar3 = pdVar6;
        if (dVar7 <= *pdVar6) {
          dVar2 = dVar7;
          pdVar3 = pdVar5;
        }
        pdVar5 = pdVar3;
        dVar7 = dVar2;
        pdVar6 = pdVar6 + 1;
      } while (pdVar6 != last._M_current);
    }
    dVar8 = dVar9 * (*pdVar5 - dVar8) + dVar8;
  }
  return dVar8;
}

Assistant:

double weighted_average_quantile(int k, int q, std::vector<double>::iterator first, std::vector<double>::iterator last) {
                auto count = last - first;
                double idx = (count - 1) * k / static_cast<double>(q);
                int j = static_cast<int>(idx);
                double g = idx - j;
                std::nth_element(first, first + j, last);
                auto xj = first[j];
                if ( directCompare( g, 0 ) ) {
                    return xj;
                }

                auto xj1 = *std::min_element(first + (j + 1), last);
                return xj + g * (xj1 - xj);
            }